

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3b8fd3::QDynamicFileResourceRoot::~QDynamicFileResourceRoot
          (QDynamicFileResourceRoot *this)

{
  bool bVar1;
  QDynamicFileResourceRoot *in_RDI;
  qsizetype in_stack_ffffffffffffffd8;
  QDynamicBufferResourceRoot *in_stack_ffffffffffffffe0;
  
  (in_RDI->super_QDynamicBufferResourceRoot).super_QResourceRoot._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicFileResourceRoot_00be3a18;
  bVar1 = wasMemoryMapped(in_RDI);
  if (bVar1) {
    unmap_sys(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    in_stack_ffffffffffffffe0 =
         (QDynamicBufferResourceRoot *)
         QDynamicBufferResourceRoot::mappingBuffer(&in_RDI->super_QDynamicBufferResourceRoot);
    if (in_stack_ffffffffffffffe0 != (QDynamicBufferResourceRoot *)0x0) {
      operator_delete__(in_stack_ffffffffffffffe0);
    }
  }
  QString::~QString((QString *)0x2eb972);
  QDynamicBufferResourceRoot::~QDynamicBufferResourceRoot(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

~QDynamicFileResourceRoot() {
        if (wasMemoryMapped())
            unmap_sys(unmapPointer, unmapLength);
        else
            delete[] mappingBuffer();
    }